

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1dc7c::
ARTScanTest_scanFromForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::TestBody(ARTScanTest_scanFromForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  size_t *this_00;
  uint64_t *__mutex;
  byte *pbVar1;
  int iVar2;
  char *message;
  bool bVar3;
  value_view v;
  value_view v_00;
  value_view v_01;
  value_view v_02;
  value_view v_03;
  undefined1 local_2b0 [8];
  iterator it;
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  verifier;
  uint64_t n;
  Message local_30;
  bool match;
  
  this_00 = &it.keybuf_.off;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::tree_verifier((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                   *)this_00,false);
  v._M_extent._M_extent_value = 1;
  v._M_ptr = &unodb::test::test_value_1;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)this_00,0,v,false);
  v_00._M_extent._M_extent_value = 2;
  v_00._M_ptr = (pointer)&unodb::test::test_value_2;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)&it.keybuf_.off,1,v_00,false);
  v_01._M_extent._M_extent_value = 3;
  v_01._M_ptr = (pointer)&unodb::test::test_value_3;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)&it.keybuf_.off,2,v_01,false);
  v_02._M_extent._M_extent_value = 4;
  v_02._M_ptr = (pointer)&unodb::test::test_value_4;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)&it.keybuf_.off,3,v_02,false);
  v_03._M_extent._M_extent_value = 5;
  v_03._M_ptr = (pointer)&unodb::test::test_value_5;
  unodb::test::
  tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  ::insert_internal((tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
                     *)&it.keybuf_.off,4,v_03,false);
  verifier.key_views.
  super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __mutex = &verifier.test_db.db_.key_prefix_splits;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar2 == 0) {
    local_30.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ =
         (uint)local_30.ss_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl & 0xffffff00;
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::
    iterator((iterator *)local_2b0,
             (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::seek
              ((iterator *)local_2b0,(art_key_type)0x100000000000000,(bool *)&local_30,true);
    while ((it.stack_.c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node !=
            (_Map_pointer)
            it.stack_.c.
            super__Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
            ._M_impl.super__Deque_impl_data._M_map_size &&
           (pbVar1 = (verifier.key_views.
                      super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->_M_elems,
           bVar3 = verifier.key_views.
                   super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0,
           verifier.key_views.
           super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(pbVar1 + 1), bVar3))) {
      unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::iterator::next
                ((iterator *)local_2b0);
    }
    (anonymous_namespace)::
    ARTScanTest_scanFromForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
    ::TestBody((ARTScanTest_scanFromForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
                *)local_2b0);
    std::
    _Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
    ::~_Deque_base((_Deque_base<unodb::detail::iter_result<unodb::detail::node_header>,_std::allocator<unodb::detail::iter_result<unodb::detail::node_header>_>_>
                    *)&it);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    local_30.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)local_2b0,"(1)","(n)",(int *)&local_30,
               (unsigned_long *)
               &verifier.key_views.
                super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_2b0[0] ==
        (ARTScanTest_scanFromForwardFiveLeavesHaltEarly_Test<unodb::mutex_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
         )0x0) {
      testing::Message::Message(&local_30);
      if (it.db_ == (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
        message = "";
      }
      else {
        message = (char *)((it.db_)->root).tagged_ptr;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&n,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/test_art_scan.cpp"
                 ,0x1b4,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&n,&local_30);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&n);
      if ((long *)CONCAT44(local_30.ss_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl._4_4_,
                           (uint)local_30.ss_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_30.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_4_,
                                       (uint)local_30.ss_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                             ._M_head_impl) + 8))();
      }
    }
    if (it.db_ != (db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&it,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          it.db_);
    }
    if (verifier._224_8_ != 0) {
      operator_delete((void *)verifier._224_8_,
                      (long)verifier.key_views.
                            super__Vector_base<std::array<std::byte,_8UL>,_std::allocator<std::array<std::byte,_8UL>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - verifier._224_8_);
    }
    std::
    _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
    ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>,_unodb::test::tree_verifier<unodb::mutex_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::comparator,_std::allocator<std::pair<const_unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>_>
                 *)&verifier.test_db.mutex.super___mutex_base._M_mutex.__data.__list.__next);
    unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>::~db
              ((db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_> *)&verifier);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanFromForwardFiveLeavesHaltEarly) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  verifier.insert(1, unodb::test::test_values[1]);
  verifier.insert(2, unodb::test::test_values[2]);
  verifier.insert(3, unodb::test::test_values[3]);
  verifier.insert(4, unodb::test::test_values[4]);
  uint64_t n = 0;
  const auto fn =
      [&n](const unodb::visitor<typename TypeParam::iterator>&) noexcept {
        n++;
        return n == 1;  // halt early!
      };
  db.scan_from(1, fn);
  UNODB_EXPECT_EQ(1, n);
}